

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Annotation.cpp
# Opt level: O2

void __thiscall soul::Annotation::set(Annotation *this,string *name,ValueView *value)

{
  MainType MVar1;
  bool value_00;
  int32_t value_01;
  int64_t value_02;
  float value_03;
  double value_04;
  allocator<char> local_61;
  string local_60;
  string local_40;
  string_view local_20;
  
  MVar1 = (value->type).mainType;
  if (MVar1 == boolean) {
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    value_00 = choc::value::ValueView::getBool(value);
    set(this,&local_60,value_00);
  }
  else if (MVar1 == string) {
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    local_20 = choc::value::ValueView::getString(value);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_40,&local_20,&local_61);
    set(this,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else if (MVar1 == int64) {
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    value_02 = choc::value::ValueView::getInt64(value);
    set(this,&local_60,value_02);
  }
  else if (MVar1 == float32) {
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    value_03 = choc::value::ValueView::getFloat32(value);
    set(this,&local_60,value_03);
  }
  else if (MVar1 == float64) {
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    value_04 = choc::value::ValueView::getFloat64(value);
    set(this,&local_60,value_04);
  }
  else {
    if (MVar1 != int32) {
      throwInternalCompilerError("set",0xdb);
    }
    std::__cxx11::string::string((string *)&local_60,(string *)name);
    value_01 = choc::value::ValueView::getInt32(value);
    set(this,&local_60,value_01);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void Annotation::set (const std::string& name, const choc::value::ValueView& value)
{
    if (value.isInt32())    return set (std::string (name), value.getInt32());
    if (value.isInt64())    return set (std::string (name), value.getInt64());
    if (value.isFloat32())  return set (std::string (name), value.getFloat32());
    if (value.isFloat64())  return set (std::string (name), value.getFloat64());
    if (value.isBool())     return set (std::string (name), value.getBool());
    if (value.isString())   return set (std::string (name), std::string (value.getString()));

    SOUL_ASSERT_FALSE; // other types not currently handled..
}